

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O2

string * __thiscall
ZXing::Content::text_abi_cxx11_(string *__return_storage_ptr__,Content *this,TextMode mode)

{
  ContentType CVar1;
  char *in_RCX;
  undefined7 in_register_00000011;
  ByteArray *bytes;
  undefined8 extraout_RDX;
  bool withECI;
  string *psVar2;
  string_view gs1;
  string_view utf8;
  string_view str;
  string local_58;
  string local_38;
  
  bytes = (ByteArray *)CONCAT71(in_register_00000011,mode);
LAB_0014ed42:
  switch((ulong)bytes & 0xff) {
  case 0:
switchD_0014ed55_caseD_0:
    withECI = false;
LAB_0014edec:
    render_abi_cxx11_(__return_storage_ptr__,this,withECI);
    return __return_storage_ptr__;
  case 1:
    withECI = true;
    goto LAB_0014edec;
  case 2:
    break;
  case 3:
    ToHex_abi_cxx11_(__return_storage_ptr__,(ZXing *)this,bytes);
    return __return_storage_ptr__;
  case 4:
    render_abi_cxx11_(&local_58,this,false);
    utf8._M_str = in_RCX;
    utf8._M_len = (size_t)local_58._M_dataplus._M_p;
    EscapeNonGraphical_abi_cxx11_(__return_storage_ptr__,(ZXing *)local_58._M_string_length,utf8);
    goto LAB_0014ee31;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  CVar1 = type(this);
  if (CVar1 == Text) goto switchD_0014ed55_caseD_0;
  if (CVar1 == ISO15434) {
    render_abi_cxx11_(&local_58,this,false);
    str._M_str = in_RCX;
    str._M_len = (size_t)local_58._M_dataplus._M_p;
    HRIFromISO15434_abi_cxx11_(__return_storage_ptr__,(ZXing *)local_58._M_string_length,str);
    goto LAB_0014ee31;
  }
  bytes = (ByteArray *)CONCAT71((int7)((ulong)extraout_RDX >> 8),4);
  if (CVar1 == GS1) {
    render_abi_cxx11_(&local_58,this,false);
    gs1._M_str = in_RCX;
    gs1._M_len = (size_t)local_58._M_dataplus._M_p;
    HRIFromGS1_abi_cxx11_(&local_38,(ZXing *)local_58._M_string_length,gs1);
    psVar2 = &local_38;
    if (local_38._M_string_length == 0) {
      psVar2 = &local_58;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_38);
LAB_0014ee31:
    std::__cxx11::string::~string((string *)&local_58);
    return __return_storage_ptr__;
  }
  goto LAB_0014ed42;
}

Assistant:

std::string Content::text(TextMode mode) const
{
	switch (mode) {
	case TextMode::Plain: return render(false);
	case TextMode::ECI: return render(true);
	case TextMode::HRI:
		switch (type()) {
		case ContentType::GS1: {
			auto plain = render(false);
			auto hri = HRIFromGS1(plain);
			return hri.empty() ? plain : hri;
		}
		case ContentType::ISO15434: return HRIFromISO15434(render(false));
		case ContentType::Text: return render(false);
		default: return text(TextMode::Escaped);
		}
	case TextMode::Hex: return ToHex(bytes);
	case TextMode::Escaped: return EscapeNonGraphical(render(false));
	}

	return {}; // silence compiler warning
}